

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O2

x86XmmReg GenCodeLoadDoubleFromPointerIntoRegister
                    (CodeGenRegVmContext *ctx,x86Reg tempReg,uchar reg,uint offset)

{
  x86XmmReg reg1;
  int iVar1;
  undefined7 in_register_00000011;
  
  iVar1 = (int)CONCAT71(in_register_00000011,reg);
  if (iVar1 == 1) {
    tempReg = rR15;
  }
  else if (iVar1 == 2) {
    tempReg = rR14;
  }
  else if (iVar1 == 3) {
    tempReg = rEBX;
  }
  else {
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,tempReg,sQWORD,rEBX,(uint)reg << 3);
  }
  reg1 = CodeGenGenericContext::FindXmmRegAtMemory(&ctx->ctx,sQWORD,rNONE,1,tempReg,offset,true);
  if (reg1 == rXmmRegCount) {
    reg1 = CodeGenGenericContext::GetXmmReg(&ctx->ctx);
    EMIT_OP_REG_RPTR(&ctx->ctx,o_movsd,reg1,sQWORD,tempReg,offset);
  }
  return reg1;
}

Assistant:

x86XmmReg GenCodeLoadDoubleFromPointerIntoRegister(CodeGenRegVmContext &ctx, x86Reg tempReg, unsigned char reg, unsigned offset)
{
	if(reg == rvrrRegisters)
	{
		x86XmmReg targetReg = ctx.ctx.FindXmmRegAtMemory(sQWORD, rNONE, 1, rREG, offset, true);

		if(targetReg != rXmmRegCount)
			return targetReg;

		targetReg = ctx.ctx.GetXmmReg();

		EMIT_OP_REG_RPTR(ctx.ctx, o_movsd, targetReg, sQWORD, rREG, offset); // Load double value

		return targetReg;
	}

	if(reg == rvrrFrame)
	{
		x86XmmReg targetReg = ctx.ctx.FindXmmRegAtMemory(sQWORD, rNONE, 1, rR15, offset, true);

		if(targetReg != rXmmRegCount)
			return targetReg;

		targetReg = ctx.ctx.GetXmmReg();

		EMIT_OP_REG_RPTR(ctx.ctx, o_movsd, targetReg, sQWORD, rR15, offset); // Load double value

		return targetReg;
	}

	if(reg == rvrrConstants)
	{
		x86XmmReg targetReg = ctx.ctx.FindXmmRegAtMemory(sQWORD, rNONE, 1, rR14, offset, true);

		if(targetReg != rXmmRegCount)
			return targetReg;

		targetReg = ctx.ctx.GetXmmReg();

		EMIT_OP_REG_RPTR(ctx.ctx, o_movsd, targetReg, sQWORD, rR14, offset); // Load double value

		return targetReg;
	}

	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, tempReg, sQWORD, rREG, reg * 8); // Load source pointer

	x86XmmReg targetReg = ctx.ctx.FindXmmRegAtMemory(sQWORD, rNONE, 1, tempReg, offset, true);

	if(targetReg != rXmmRegCount)
		return targetReg;

	targetReg = ctx.ctx.GetXmmReg();

	EMIT_OP_REG_RPTR(ctx.ctx, o_movsd, targetReg, sQWORD, tempReg, offset); // Load double value

	return targetReg;
}